

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O0

void Nwk_ManMarkFanouts_rec(Nwk_Obj_t *pLut,int nLevMax,int nFanMax)

{
  int iVar1;
  bool bVar2;
  int local_24;
  Nwk_Obj_t *pNStack_20;
  int i;
  Nwk_Obj_t *pNext;
  int nFanMax_local;
  int nLevMax_local;
  Nwk_Obj_t *pLut_local;
  
  iVar1 = Nwk_ObjIsNode(pLut);
  if ((iVar1 != 0) && (iVar1 = Nwk_ObjIsTravIdCurrent(pLut), iVar1 == 0)) {
    Nwk_ObjSetTravIdCurrent(pLut);
    iVar1 = Nwk_ObjLevel(pLut);
    if ((iVar1 <= nLevMax) && (iVar1 = Nwk_ObjFanoutNum(pLut), iVar1 <= nFanMax)) {
      local_24 = 0;
      while( true ) {
        bVar2 = false;
        if (local_24 < pLut->nFanouts) {
          pNStack_20 = pLut->pFanio[pLut->nFanins + local_24];
          bVar2 = pNStack_20 != (Nwk_Obj_t *)0x0;
        }
        if (!bVar2) break;
        Nwk_ManMarkFanouts_rec(pNStack_20,nLevMax,nFanMax);
        local_24 = local_24 + 1;
      }
    }
  }
  return;
}

Assistant:

void Nwk_ManMarkFanouts_rec( Nwk_Obj_t * pLut, int nLevMax, int nFanMax )
{
    Nwk_Obj_t * pNext;
    int i;
    if ( !Nwk_ObjIsNode(pLut) )
        return;
    if ( Nwk_ObjIsTravIdCurrent( pLut ) )
        return;
    Nwk_ObjSetTravIdCurrent( pLut );
    if ( Nwk_ObjLevel(pLut) > nLevMax )
        return;
    if ( Nwk_ObjFanoutNum(pLut) > nFanMax )
        return;
    Nwk_ObjForEachFanout( pLut, pNext, i )
        Nwk_ManMarkFanouts_rec( pNext, nLevMax, nFanMax );
}